

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O0

LocalSocketError __thiscall QLocalSocket::error(QLocalSocket *this)

{
  SocketError SVar1;
  QLocalSocketPrivate *d;
  LocalSocketError local_4;
  
  d_func((QLocalSocket *)0x389237);
  SVar1 = QAbstractSocket::error((QAbstractSocket *)0x38924d);
  switch(SVar1) {
  case ConnectionRefusedError:
    local_4 = ConnectionRefusedError;
    break;
  case RemoteHostClosedError:
    local_4 = PeerClosedError;
    break;
  case HostNotFoundError:
    local_4 = ServerNotFoundError;
    break;
  case SocketAccessError:
    local_4 = SocketAccessError;
    break;
  case SocketResourceError:
    local_4 = SocketResourceError;
    break;
  case SocketTimeoutError:
    local_4 = SocketTimeoutError;
    break;
  case DatagramTooLargeError:
    local_4 = DatagramTooLargeError;
    break;
  case NetworkError:
    local_4 = ConnectionError;
    break;
  default:
    local_4 = UnknownSocketError;
    break;
  case UnsupportedSocketOperationError:
    local_4 = UnsupportedSocketOperationError;
    break;
  case UnknownSocketError:
    local_4 = UnknownSocketError;
  }
  return local_4;
}

Assistant:

QLocalSocket::LocalSocketError QLocalSocket::error() const
{
    Q_D(const QLocalSocket);
    switch (d->unixSocket.error()) {
    case QAbstractSocket::ConnectionRefusedError:
        return QLocalSocket::ConnectionRefusedError;
    case QAbstractSocket::RemoteHostClosedError:
        return QLocalSocket::PeerClosedError;
    case QAbstractSocket::HostNotFoundError:
        return QLocalSocket::ServerNotFoundError;
    case QAbstractSocket::SocketAccessError:
        return QLocalSocket::SocketAccessError;
    case QAbstractSocket::SocketResourceError:
        return QLocalSocket::SocketResourceError;
    case QAbstractSocket::SocketTimeoutError:
        return QLocalSocket::SocketTimeoutError;
    case QAbstractSocket::DatagramTooLargeError:
        return QLocalSocket::DatagramTooLargeError;
    case QAbstractSocket::NetworkError:
        return QLocalSocket::ConnectionError;
    case QAbstractSocket::UnsupportedSocketOperationError:
        return QLocalSocket::UnsupportedSocketOperationError;
    case QAbstractSocket::UnknownSocketError:
        return QLocalSocket::UnknownSocketError;
    default:
#if defined QLOCALSOCKET_DEBUG
        qWarning() << "QLocalSocket error not handled:" << d->unixSocket.error();
#endif
        break;
    }
    return UnknownSocketError;
}